

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

bool goodform::convert<long>(any *v,long *dest)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  short *psVar5;
  int *piVar6;
  ulong *puVar7;
  byte *pbVar8;
  unsigned_short *puVar9;
  uint *puVar10;
  float *pfVar11;
  double *pdVar12;
  
  bVar1 = can_be<long>(v);
  if (!bVar1) {
    return bVar1;
  }
  bVar2 = is<signed_char>(v);
  if (bVar2) {
    pcVar3 = get<signed_char>(v);
    uVar4 = (ulong)*pcVar3;
  }
  else {
    bVar2 = is<short>(v);
    if (bVar2) {
      psVar5 = get<short>(v);
      uVar4 = (ulong)*psVar5;
    }
    else {
      bVar2 = is<int>(v);
      if (bVar2) {
        piVar6 = get<int>(v);
        uVar4 = (ulong)*piVar6;
      }
      else {
        bVar2 = is<long>(v);
        if (bVar2) {
          puVar7 = (ulong *)get<long>(v);
        }
        else {
          bVar2 = is<unsigned_char>(v);
          if (bVar2) {
            pbVar8 = get<unsigned_char>(v);
            uVar4 = (ulong)*pbVar8;
            goto LAB_001299a3;
          }
          bVar2 = is<unsigned_short>(v);
          if (bVar2) {
            puVar9 = get<unsigned_short>(v);
            uVar4 = (ulong)*puVar9;
            goto LAB_001299a3;
          }
          bVar2 = is<unsigned_int>(v);
          if (bVar2) {
            puVar10 = get<unsigned_int>(v);
            uVar4 = (ulong)*puVar10;
            goto LAB_001299a3;
          }
          bVar2 = is<unsigned_long>(v);
          if (!bVar2) {
            bVar2 = is<float>(v);
            if (bVar2) {
              pfVar11 = get<float>(v);
              uVar4 = (ulong)*pfVar11;
            }
            else {
              bVar2 = is<double>(v);
              if (!bVar2) {
                return bVar1;
              }
              pdVar12 = get<double>(v);
              uVar4 = (ulong)*pdVar12;
            }
            goto LAB_001299a3;
          }
          puVar7 = get<unsigned_long>(v);
        }
        uVar4 = *puVar7;
      }
    }
  }
LAB_001299a3:
  *dest = uVar4;
  return bVar1;
}

Assistant:

bool convert(const any& v, T& dest)
  {
    if (can_be<T>(v))
    {
      if (is<std::int8_t>(v))        dest = T(get<std::int8_t>(v));
      else if (is<std::int16_t>(v))  dest = T(get<std::int16_t>(v));
      else if (is<std::int32_t>(v))  dest = T(get<std::int32_t>(v));
      else if (is<std::int64_t>(v))  dest = T(get<std::int64_t>(v));
      else if (is<std::uint8_t>(v))  dest = T(get<std::uint8_t>(v));
      else if (is<std::uint16_t>(v)) dest = T(get<std::uint16_t>(v));
      else if (is<std::uint32_t>(v)) dest = T(get<std::uint32_t>(v));
      else if (is<std::uint64_t>(v)) dest = T(get<std::uint64_t>(v));
      else if (is<float>(v))         dest = T(get<float>(v));
      else if (is<double>(v))        dest = T(get<double>(v));
      return true;
    }
    return false;
  }